

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

QPointer<QWidget> __thiscall
QHash<QGesture_*,_QPointer<QWidget>_>::value
          (QHash<QGesture_*,_QPointer<QWidget>_> *this,QGesture **key)

{
  Data *pDVar1;
  Node<QGesture_*,_QPointer<QWidget>_> *pNVar2;
  QPointer<QWidget> *pQVar3;
  QObject *in_RDX;
  QObject *extraout_RDX;
  QPointer<QWidget> QVar4;
  
  if ((Data<QHashPrivate::Node<QGesture*,QPointer<QWidget>>> *)*key !=
      (Data<QHashPrivate::Node<QGesture*,QPointer<QWidget>>> *)0x0) {
    pNVar2 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QPointer<QWidget>>>::
             findNode<QGesture*>((Data<QHashPrivate::Node<QGesture*,QPointer<QWidget>>> *)*key,
                                 (QGesture **)in_RDX);
    in_RDX = extraout_RDX;
    if (pNVar2 != (Node<QGesture_*,_QPointer<QWidget>_> *)0x0) {
      pQVar3 = &pNVar2->value;
      goto LAB_002d8d5f;
    }
  }
  pQVar3 = (QPointer<QWidget> *)0x0;
LAB_002d8d5f:
  if (pQVar3 == (QPointer<QWidget> *)0x0) {
    this->d = (Data *)0x0;
    this[1].d = (Data *)0x0;
  }
  else {
    pDVar1 = (Data *)(pQVar3->wp).d;
    this->d = pDVar1;
    this[1].d = (Data *)(pQVar3->wp).value;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QVar4.wp.value = in_RDX;
  QVar4.wp.d = (Data *)this;
  return (QPointer<QWidget>)QVar4.wp;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }